

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_codegen.c
# Opt level: O3

gravity_function_t *
gravity_codegen(gnode_t *node,gravity_delegate_t *delegate,gravity_vm *vm,_Bool add_debug)

{
  long lVar1;
  long lVar2;
  void *pvVar3;
  ircode_t *code;
  gravity_function_t *pgVar4;
  long lVar5;
  codegen_t *data;
  long local_140 [2];
  undefined8 *local_130;
  long local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  gravity_vm *local_108;
  gvisitor_t local_100;
  
  local_118 = 0;
  uStack_110 = 0;
  local_128 = 0;
  uStack_120 = 0;
  local_108 = vm;
  code = ircode_create(0);
  pgVar4 = gravity_function_new(vm,"$moduleinit",0,0,0,code);
  local_140[1] = 8;
  local_130 = (undefined8 *)malloc(0x40);
  local_140[0] = 1;
  *local_130 = pgVar4;
  local_100.nerr = 0;
  local_100.visit_pre = (_func_void_gvisitor_ptr_gnode_t_ptr *)0x0;
  local_100.visit_post = (_func_void_gvisitor_ptr_gnode_t_ptr *)0x0;
  local_100.visit_list_stmt = visit_list_stmt;
  local_100.visit_compound_stmt = visit_compound_stmt;
  local_100.visit_label_stmt = visit_label_stmt;
  local_100.visit_flow_stmt = visit_flow_stmt;
  local_100.visit_jump_stmt = visit_jump_stmt;
  local_100.visit_loop_stmt = visit_loop_stmt;
  local_100.visit_empty_stmt = visit_empty_stmt;
  local_100.visit_function_decl = visit_function_decl;
  local_100.visit_variable_decl = visit_variable_decl;
  local_100.visit_enum_decl = visit_enum_decl;
  local_100.visit_class_decl = visit_class_decl;
  local_100.visit_module_decl = visit_module_decl;
  local_100.visit_binary_expr = visit_binary_expr;
  local_100.visit_unary_expr = visit_unary_expr;
  local_100.visit_file_expr = visit_file_expr;
  local_100.visit_literal_expr = visit_literal_expr;
  local_100.visit_identifier_expr = visit_identifier_expr;
  local_100.visit_keyword_expr = visit_keyword_expr;
  local_100.visit_list_expr = visit_list_expr;
  local_100.visit_postfix_expr = visit_postfix_expr;
  local_100.data = local_140;
  local_100.bflag = add_debug;
  local_100.delegate = delegate;
  gvisit(&local_100,node);
  pvVar3 = local_100.data;
  if (local_128 != 0) {
    lVar1 = *(long *)((long)local_100.data + 0x18);
    if (lVar1 != 0) {
      lVar5 = 0;
      do {
        lVar2 = *(long *)(*(long *)((long)pvVar3 + 0x28) + lVar5 * 8);
        gravity_class_setsuper
                  (*(gravity_class_t **)(lVar2 + 0x90),
                   *(gravity_class_t **)(*(long *)(lVar2 + 0x68) + 0x90));
        lVar5 = lVar5 + 1;
      } while (lVar1 != lVar5);
    }
  }
  local_140[0] = local_140[0] + -1;
  if (local_140[0] == 0) {
    if (local_130 != (undefined8 *)0x0) {
      free(local_130);
    }
    if (local_100.nerr != 0) {
      ircode_free(code);
      (pgVar4->field_9).field_0.bytecode = (uint32_t *)0x0;
      if (local_100.nerr != 0) {
        pgVar4 = (gravity_function_t *)0x0;
      }
    }
    return pgVar4;
  }
  __assert_fail("marray_size(data.context) == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_codegen.c"
                ,0x85f,
                "gravity_function_t *gravity_codegen(gnode_t *, gravity_delegate_t *, gravity_vm *, _Bool)"
               );
}

Assistant:

gravity_function_t *gravity_codegen(gnode_t *node, gravity_delegate_t *delegate, gravity_vm *vm, bool add_debug) {
    codegen_t data = {.vm = vm, .lasterror = 0};
    marray_init(data.context);
    marray_init(data.superfix);

    ircode_t *code = ircode_create(0);
    gravity_function_t *f = gravity_function_new(vm, INITMODULE_NAME, 0, 0, 0, code);
    marray_push(gravity_object_t*, data.context, (gravity_object_t *)f);

    gvisitor_t visitor = {
        .nerr = 0,                      // used for internal codegen errors
        .data = &data,                  // used to store a pointer to codegen struct
        .bflag = add_debug,             // flag used to decide if bytecode must include debug info
        .delegate = (void *)delegate,   // compiler delegate to report errors

        // COMMON
        .visit_pre = NULL,
        .visit_post = NULL,

        // STATEMENTS: 7
        .visit_list_stmt = visit_list_stmt,
        .visit_compound_stmt = visit_compound_stmt,
        .visit_label_stmt = visit_label_stmt,
        .visit_flow_stmt = visit_flow_stmt,
        .visit_loop_stmt = visit_loop_stmt,
        .visit_jump_stmt = visit_jump_stmt,
        .visit_empty_stmt = visit_empty_stmt,

        // DECLARATIONS: 5
        .visit_function_decl = visit_function_decl,
        .visit_variable_decl = visit_variable_decl,
        .visit_enum_decl = visit_enum_decl,
        .visit_class_decl = visit_class_decl,
        .visit_module_decl = visit_module_decl,

        // EXPRESSIONS: 8
        .visit_binary_expr = visit_binary_expr,
        .visit_unary_expr = visit_unary_expr,
        .visit_file_expr = visit_file_expr,
        .visit_literal_expr = visit_literal_expr,
        .visit_identifier_expr = visit_identifier_expr,
        .visit_keyword_expr = visit_keyword_expr,
        .visit_list_expr = visit_list_expr,
        .visit_postfix_expr = visit_postfix_expr,
    };

    DEBUG_CODEGEN("=== BEGIN CODEGEN ===");
    gvisit(&visitor, node);
    DEBUG_CODEGEN("\n");

    // check for special superfix
    if (marray_size(data.superfix)) {
        fix_superclasses(&visitor);
    }

    // pop globals instance init special function
    marray_pop(data.context);
    assert(marray_size(data.context) == 0);
    marray_destroy(data.context);

    // in case of codegen errors explicity free code and return NULL
    if (visitor.nerr != 0) {ircode_free(code); f->bytecode = NULL;}
    return (visitor.nerr == 0) ? f : NULL;
}